

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_read_write_compressed_img
              (fitsfile *fptr,int datatype,LONGLONG *infpixel,LONGLONG *inlpixel,long *ininc,
              int nullcheck,void *nullval,int *anynul,fitsfile *outfptr,int *status)

{
  int iVar1;
  long *blc;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  undefined4 in_R9D;
  char *in_stack_00000008;
  undefined4 *in_stack_00000010;
  int *in_stack_00000020;
  LONGLONG firstelem;
  char *cnull;
  char *bnullarray;
  void *buffer;
  int tilenul;
  int ndim;
  int ii;
  long irow;
  long i0;
  long i1;
  long i2;
  long i3;
  long i4;
  long i5;
  long inc [6];
  long lpixel [6];
  long fpixel [6];
  long ntemp;
  long offset [6];
  long rowdim [6];
  long tlpixel [6];
  long tfpixel [6];
  long ltile [6];
  long ftile [6];
  long thistilesize [6];
  long tilesize [6];
  long tiledim [6];
  long naxis [6];
  fitsfile *in_stack_fffffffffffffc78;
  undefined1 *array;
  int *nelem;
  long firstelem_00;
  long lVar2;
  fitsfile *fptr_00;
  long local_350;
  long local_348;
  int *status_00;
  long local_338;
  int *status_01;
  long *nulval;
  long *trc;
  int in_stack_fffffffffffffcf4;
  int iVar3;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long alStack_2c8 [2];
  void *in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd54;
  int in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  fitsfile *in_stack_fffffffffffffd60;
  long alStack_298 [3];
  void *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  int *in_stack_fffffffffffffd90;
  int *in_stack_fffffffffffffd98;
  long local_230;
  long alStack_1f8 [6];
  long local_1c8;
  long local_1c0;
  fitsfile *local_1b8;
  long local_1b0;
  long local_1a8;
  int *local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168 [6];
  long local_138 [6];
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8 [6];
  long alStack_a8 [6];
  long local_78 [2];
  fitsfile *local_68;
  long local_60;
  long local_58;
  int *local_50;
  undefined4 local_3c;
  long local_38;
  long local_30;
  long local_28;
  int local_1c;
  long local_18;
  int local_c;
  
  nulval = (long *)0x0;
  if (*in_stack_00000020 < 1) {
    local_3c = in_R9D;
    local_38 = in_R8;
    local_30 = in_RCX;
    local_28 = in_RDX;
    local_1c = in_ESI;
    local_18 = in_RDI;
    iVar1 = fits_is_compressed_image(in_stack_fffffffffffffc78,(int *)0x1fee58);
    if (iVar1 == 0) {
      ffpmsg((char *)0x1fee69);
      *in_stack_00000020 = 0x19e;
      local_c = 0x19e;
    }
    else {
      if (local_1c == 0x15) {
        blc = (long *)malloc(*(long *)(*(long *)(local_18 + 8) + 0x4c8) << 1);
        if (((in_stack_00000008 != (char *)0x0) && (*in_stack_00000008 == '\0')) &&
           (in_stack_00000008[1] == '\0')) {
          local_3c = 0;
        }
      }
      else if (local_1c == 0x1f) {
        blc = (long *)malloc(*(long *)(*(long *)(local_18 + 8) + 0x4c8) << 2);
        if (((in_stack_00000008 != (char *)0x0) && (*in_stack_00000008 == '\0')) &&
           ((in_stack_00000008[1] == '\0' &&
            ((in_stack_00000008[2] == '\0' && (in_stack_00000008[3] == '\0')))))) {
          local_3c = 0;
        }
      }
      else if (local_1c == 0x29) {
        blc = (long *)malloc(*(long *)(*(long *)(local_18 + 8) + 0x4c8) << 3);
        if ((((in_stack_00000008 != (char *)0x0) && (*in_stack_00000008 == '\0')) &&
            (in_stack_00000008[1] == '\0')) &&
           ((in_stack_00000008[2] == '\0' && (in_stack_00000008[3] == '\0')))) {
          local_3c = 0;
        }
      }
      else if (local_1c == 0x2a) {
        blc = (long *)malloc(*(long *)(*(long *)(local_18 + 8) + 0x4c8) << 2);
        if (((in_stack_00000008 != (char *)0x0) && (*in_stack_00000008 == '\0')) &&
           ((in_stack_00000008[1] == '\0' &&
            ((in_stack_00000008[2] == '\0' && (in_stack_00000008[3] == '\0')))))) {
          local_3c = 0;
        }
      }
      else if (local_1c == 0x52) {
        blc = (long *)malloc(*(long *)(*(long *)(local_18 + 8) + 0x4c8) << 3);
        if (((in_stack_00000008 != (char *)0x0) && (*in_stack_00000008 == '\0')) &&
           ((((in_stack_00000008[1] == '\0' &&
              ((in_stack_00000008[2] == '\0' && (in_stack_00000008[3] == '\0')))) &&
             (in_stack_00000008[4] == '\0')) &&
            (((in_stack_00000008[5] == '\0' && (in_stack_00000008[6] == '\0')) &&
             (in_stack_00000008[7] == '\0')))))) {
          local_3c = 0;
        }
      }
      else if (local_1c == 0x14) {
        blc = (long *)malloc(*(long *)(*(long *)(local_18 + 8) + 0x4c8) << 1);
        if (((in_stack_00000008 != (char *)0x0) && (*in_stack_00000008 == '\0')) &&
           (in_stack_00000008[1] == '\0')) {
          local_3c = 0;
        }
      }
      else if (local_1c == 0x1e) {
        blc = (long *)malloc(*(long *)(*(long *)(local_18 + 8) + 0x4c8) << 2);
        if (((in_stack_00000008 != (char *)0x0) && (*in_stack_00000008 == '\0')) &&
           ((in_stack_00000008[1] == '\0' &&
            ((in_stack_00000008[2] == '\0' && (in_stack_00000008[3] == '\0')))))) {
          local_3c = 0;
        }
      }
      else if (local_1c == 0x28) {
        blc = (long *)malloc(*(long *)(*(long *)(local_18 + 8) + 0x4c8) << 3);
        if ((((in_stack_00000008 != (char *)0x0) && (*in_stack_00000008 == '\0')) &&
            (in_stack_00000008[1] == '\0')) &&
           ((in_stack_00000008[2] == '\0' && (in_stack_00000008[3] == '\0')))) {
          local_3c = 0;
        }
      }
      else {
        if ((local_1c != 0xb) && (local_1c != 0xc)) {
          ffpmsg((char *)0x1ff2db);
          *in_stack_00000020 = 0x19a;
          return 0x19a;
        }
        blc = (long *)malloc(*(size_t *)(*(long *)(local_18 + 8) + 0x4c8));
        if ((in_stack_00000008 != (char *)0x0) && (*in_stack_00000008 == '\0')) {
          local_3c = 0;
        }
      }
      if (blc == (long *)0x0) {
        ffpmsg((char *)0x1ff31d);
        *in_stack_00000020 = 0x71;
        local_c = 0x71;
      }
      else {
        for (iVar1 = 0; iVar1 < 6; iVar1 = iVar1 + 1) {
          local_78[iVar1] = 1;
          alStack_a8[iVar1] = 1;
          local_d8[iVar1] = 1;
          local_138[iVar1] = 1;
          local_168[iVar1] = 1;
          alStack_1f8[iVar1] = 1;
        }
        iVar1 = *(int *)(*(long *)(local_18 + 8) + 0x490);
        local_230 = 1;
        for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
          if (*(long *)(local_30 + (long)iVar3 * 8) < *(long *)(local_28 + (long)iVar3 * 8)) {
            *(undefined8 *)(&stack0xfffffffffffffd98 + (long)iVar3 * 8) =
                 *(undefined8 *)(local_30 + (long)iVar3 * 8);
            alStack_298[iVar3] = *(long *)(local_28 + (long)iVar3 * 8);
            alStack_2c8[iVar3] = -*(long *)(local_38 + (long)iVar3 * 8);
          }
          else {
            *(undefined8 *)(&stack0xfffffffffffffd98 + (long)iVar3 * 8) =
                 *(undefined8 *)(local_28 + (long)iVar3 * 8);
            alStack_298[iVar3] = *(long *)(local_30 + (long)iVar3 * 8);
            alStack_2c8[iVar3] = *(long *)(local_38 + (long)iVar3 * 8);
          }
          local_78[iVar3] = *(long *)(*(long *)(local_18 + 8) + 0x498 + (long)iVar3 * 8);
          if (*(long *)(&stack0xfffffffffffffd98 + (long)iVar3 * 8) < 1) {
            free(blc);
            *in_stack_00000020 = 0x141;
            return 0x141;
          }
          local_d8[iVar3] = *(long *)(*(long *)(local_18 + 8) + 0x440 + (long)iVar3 * 8);
          alStack_a8[iVar3] = (local_78[iVar3] + -1) / local_d8[iVar3] + 1;
          local_138[iVar3] =
               (*(long *)(&stack0xfffffffffffffd98 + (long)iVar3 * 8) + -1) / local_d8[iVar3] + 1;
          if ((alStack_298[iVar3] + -1) / local_d8[iVar3] + 1 < alStack_a8[iVar3]) {
            local_338 = (alStack_298[iVar3] + -1) / local_d8[iVar3] + 1;
          }
          else {
            local_338 = alStack_a8[iVar3];
          }
          local_168[iVar3] = local_338;
          alStack_1f8[iVar3] = local_230;
          local_230 = alStack_a8[iVar3] * local_230;
        }
        if (in_stack_00000010 != (undefined4 *)0x0) {
          *in_stack_00000010 = 0;
        }
        status_01 = (int *)0x1;
        for (local_2d0 = local_138[5]; local_2d0 <= local_168[5]; local_2d0 = local_2d0 + 1) {
          local_170 = (local_2d0 + -1) * local_d8[5] + 1;
          status_00 = local_50;
          if (local_170 + local_d8[5] + -1 < (long)local_50) {
            status_00 = (int *)(local_170 + local_d8[5] + -1);
          }
          local_e0 = (long)status_00 + (1 - local_170);
          local_1a0 = status_00;
          for (local_2d8 = local_138[4]; local_2d8 <= local_168[4]; local_2d8 = local_2d8 + 1) {
            local_178 = (local_2d8 + -1) * local_d8[4] + 1;
            if (local_178 + local_d8[4] + -1 < local_58) {
              local_348 = local_178 + local_d8[4] + -1;
            }
            else {
              local_348 = local_58;
            }
            local_1a8 = local_348;
            local_e8 = local_e0 * ((local_348 - local_178) + 1);
            for (local_2e0 = local_138[3]; local_2e0 <= local_168[3]; local_2e0 = local_2e0 + 1) {
              local_180 = (local_2e0 + -1) * local_d8[3] + 1;
              if (local_180 + local_d8[3] + -1 < local_60) {
                local_350 = local_180 + local_d8[3] + -1;
              }
              else {
                local_350 = local_60;
              }
              local_1b0 = local_350;
              local_f0 = local_e8 * ((local_350 - local_180) + 1);
              for (local_2e8 = local_138[2]; local_2e8 <= local_168[2]; local_2e8 = local_2e8 + 1) {
                local_188 = (local_2e8 + -1) * local_d8[2] + 1;
                fptr_00 = local_68;
                if (local_188 + local_d8[2] + -1 < (long)local_68) {
                  fptr_00 = (fitsfile *)(local_188 + local_d8[2] + -1);
                }
                local_f8 = local_f0 * ((long)fptr_00 + (1 - local_188));
                local_1b8 = fptr_00;
                for (local_2f0 = local_138[1]; local_2f0 <= local_168[1]; local_2f0 = local_2f0 + 1)
                {
                  local_190 = (local_2f0 + -1) * local_d8[1] + 1;
                  lVar2 = local_78[1];
                  if (local_190 + local_d8[1] + -1 < local_78[1]) {
                    lVar2 = local_190 + local_d8[1] + -1;
                  }
                  local_100 = local_f8 * ((lVar2 - local_190) + 1);
                  local_1c0 = lVar2;
                  for (local_2f8 = local_138[0]; local_2f8 <= local_168[0];
                      local_2f8 = local_2f8 + 1) {
                    local_198 = (local_2f8 + -1) * local_d8[0] + 1;
                    firstelem_00 = local_78[0];
                    if (local_198 + local_d8[0] + -1 < local_78[0]) {
                      firstelem_00 = local_198 + local_d8[0] + -1;
                    }
                    local_108 = local_100 * ((firstelem_00 - local_198) + 1);
                    array = &stack0xfffffffffffffcf4;
                    nelem = in_stack_00000020;
                    trc = nulval;
                    local_1c8 = firstelem_00;
                    imcomp_decompress_tile
                              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
                               in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,
                               in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                               in_stack_fffffffffffffd80,in_stack_fffffffffffffd88,
                               in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
                    if ((in_stack_fffffffffffffcf4 == 0) || (in_stack_00000010 == (undefined4 *)0x0)
                       ) {
                      ffpss((fitsfile *)CONCAT44(iVar3,iVar1),in_stack_fffffffffffffcf4,blc,trc,
                            in_stack_00000008,status_01);
                    }
                    else {
                      ffppn(fptr_00,(int)((ulong)lVar2 >> 0x20),firstelem_00,(LONGLONG)nelem,array,
                            nulval,status_00);
                    }
                    status_01 = (int *)(local_108 + (long)status_01);
                    nulval = trc;
                  }
                }
              }
            }
          }
        }
        free(blc);
        local_c = *in_stack_00000020;
      }
    }
  }
  else {
    local_c = *in_stack_00000020;
  }
  return local_c;
}

Assistant:

int fits_read_write_compressed_img(fitsfile *fptr,   /* I - FITS file pointer      */
            int  datatype,  /* I - datatype of the array to be returned      */
            LONGLONG  *infpixel, /* I - 'bottom left corner' of the subsection    */
            LONGLONG  *inlpixel, /* I - 'top right corner' of the subsection      */
            long  *ininc,    /* I - increment to be applied in each dimension */
            int  nullcheck,  /* I - 0 for no null checking                   */
                              /*     1: set undefined pixels = nullval       */
            void *nullval,    /* I - value for undefined pixels              */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            fitsfile *outfptr,   /* I - FITS file pointer                    */
            int  *status)     /* IO - error status                           */
/*
   This is similar to fits_read_compressed_img, except that it writes
   the pixels to the output image, on a tile by tile basis instead of returning
   the array.
*/
{
    long naxis[MAX_COMPRESS_DIM], tiledim[MAX_COMPRESS_DIM];
    long tilesize[MAX_COMPRESS_DIM], thistilesize[MAX_COMPRESS_DIM];
    long ftile[MAX_COMPRESS_DIM], ltile[MAX_COMPRESS_DIM];
    long tfpixel[MAX_COMPRESS_DIM], tlpixel[MAX_COMPRESS_DIM];
    long rowdim[MAX_COMPRESS_DIM], offset[MAX_COMPRESS_DIM],ntemp;
    long fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long inc[MAX_COMPRESS_DIM];
    long i5, i4, i3, i2, i1, i0, irow;
    int ii, ndim, tilenul;
    void *buffer;
    char *bnullarray = 0, *cnull;
    LONGLONG firstelem;

    if (*status > 0) 
        return(*status);

    if (!fits_is_compressed_image(fptr, status) )
    {
        ffpmsg("CHDU is not a compressed image (fits_read_compressed_img)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    cnull = (char *) nullval;  /* used to test if the nullval = 0 */
    
    /* get temporary space for uncompressing one image tile */
    /* If nullval == 0, then this means that the */
    /* calling routine does not want to check for null pixels in the array */
    if (datatype == TSHORT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (short)); 
       if (cnull) {
         if (cnull[0] == 0 && cnull[1] == 0 ) {
           nullcheck = 0;
	 }
       }
    }
    else if (datatype == TINT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (int));
       if (cnull) {
         if (cnull[0] == 0 && cnull[1] == 0 && cnull[2] == 0 && cnull[3] == 0 ) {
           nullcheck = 0;
	 }
       }
    }
    else if (datatype == TLONG)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (long));
       if (cnull) {
         if (cnull[0] == 0 && cnull[1] == 0 && cnull[2] == 0 && cnull[3] == 0 ) {
           nullcheck = 0;
	 }
       }
    }
    else if (datatype == TFLOAT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (float));
       if (cnull) {
         if (cnull[0] == 0 && cnull[1] == 0 && cnull[2] == 0 && cnull[3] == 0  ) {
           nullcheck = 0;
	 }
       }
    }
    else if (datatype == TDOUBLE)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (double));
       if (cnull) {
         if (cnull[0] == 0 && cnull[1] == 0 && cnull[2] == 0 && cnull[3] == 0 &&
	     cnull[4] == 0 && cnull[5] == 0 && cnull[6] == 0 && cnull[7] == 0 ) {
           nullcheck = 0;
	 }
       }
    }
    else if (datatype == TUSHORT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (unsigned short));
       if (cnull) {
         if (cnull[0] == 0 && cnull[1] == 0 ){
           nullcheck = 0;
	 }
       }
    }
    else if (datatype == TUINT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (unsigned int));
       if (cnull) {
         if (cnull[0] == 0 && cnull[1] == 0 && cnull[2] == 0 && cnull[3] == 0 ){
           nullcheck = 0;
	 }
       }
    }
    else if (datatype == TULONG)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (unsigned long));
       if (cnull) {
         if (cnull[0] == 0 && cnull[1] == 0 && cnull[2] == 0 && cnull[3] == 0 ){
           nullcheck = 0;
	 }
       }
    }
    else if (datatype == TBYTE || datatype == TSBYTE)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (char));
       if (cnull) {
         if (cnull[0] == 0){
           nullcheck = 0;
	 }
       }
    }
    else
    {
        ffpmsg("unsupported datatype for uncompressing image");
        return(*status = BAD_DATATYPE);
    }

    if (buffer == NULL)
    {
	    ffpmsg("Out of memory (fits_read_compress_img)");
	    return (*status = MEMORY_ALLOCATION);
    }

    /* initialize all the arrays */
    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        naxis[ii] = 1;
        tiledim[ii] = 1;
        tilesize[ii] = 1;
        ftile[ii] = 1;
        ltile[ii] = 1;
        rowdim[ii] = 1;
    }

    ndim = (fptr->Fptr)->zndim;
    ntemp = 1;
    for (ii = 0; ii < ndim; ii++)
    {
        /* support for mirror-reversed image sections */
        if (infpixel[ii] <= inlpixel[ii])
        {
           fpixel[ii] = (long) infpixel[ii];
           lpixel[ii] = (long) inlpixel[ii];
           inc[ii]    = ininc[ii];
        }
        else
        {
           fpixel[ii] = (long) inlpixel[ii];
           lpixel[ii] = (long) infpixel[ii];
           inc[ii]    = -ininc[ii];
        }

        /* calc number of tiles in each dimension, and tile containing */
        /* the first and last pixel we want to read in each dimension  */
        naxis[ii] = (fptr->Fptr)->znaxis[ii];
        if (fpixel[ii] < 1)
        {
            free(buffer);
            return(*status = BAD_PIX_NUM);
        }

        tilesize[ii] = (fptr->Fptr)->tilesize[ii];
        tiledim[ii] = (naxis[ii] - 1) / tilesize[ii] + 1;
        ftile[ii]   = (fpixel[ii] - 1)   / tilesize[ii] + 1;
        ltile[ii]   = minvalue((lpixel[ii] - 1) / tilesize[ii] + 1, 
                                tiledim[ii]);
        rowdim[ii]  = ntemp;  /* total tiles in each dimension */
        ntemp *= tiledim[ii];
    }

    if (anynul)
       *anynul = 0;  /* initialize */

    firstelem = 1;

    /* support up to 6 dimensions for now */
    /* tfpixel and tlpixel are the first and last image pixels */
    /* along each dimension of the compression tile */
    for (i5 = ftile[5]; i5 <= ltile[5]; i5++)
    {
     tfpixel[5] = (i5 - 1) * tilesize[5] + 1;
     tlpixel[5] = minvalue(tfpixel[5] + tilesize[5] - 1, 
                            naxis[5]);
     thistilesize[5] = tlpixel[5] - tfpixel[5] + 1;
     offset[5] = (i5 - 1) * rowdim[5];
     for (i4 = ftile[4]; i4 <= ltile[4]; i4++)
     {
      tfpixel[4] = (i4 - 1) * tilesize[4] + 1;
      tlpixel[4] = minvalue(tfpixel[4] + tilesize[4] - 1, 
                            naxis[4]);
      thistilesize[4] = thistilesize[5] * (tlpixel[4] - tfpixel[4] + 1);
      offset[4] = (i4 - 1) * rowdim[4] + offset[5];
      for (i3 = ftile[3]; i3 <= ltile[3]; i3++)
      {
        tfpixel[3] = (i3 - 1) * tilesize[3] + 1;
        tlpixel[3] = minvalue(tfpixel[3] + tilesize[3] - 1, 
                              naxis[3]);
        thistilesize[3] = thistilesize[4] * (tlpixel[3] - tfpixel[3] + 1);
        offset[3] = (i3 - 1) * rowdim[3] + offset[4];
        for (i2 = ftile[2]; i2 <= ltile[2]; i2++)
        {
          tfpixel[2] = (i2 - 1) * tilesize[2] + 1;
          tlpixel[2] = minvalue(tfpixel[2] + tilesize[2] - 1, 
                                naxis[2]);
          thistilesize[2] = thistilesize[3] * (tlpixel[2] - tfpixel[2] + 1);
          offset[2] = (i2 - 1) * rowdim[2] + offset[3];
          for (i1 = ftile[1]; i1 <= ltile[1]; i1++)
          {
            tfpixel[1] = (i1 - 1) * tilesize[1] + 1;
            tlpixel[1] = minvalue(tfpixel[1] + tilesize[1] - 1, 
                                  naxis[1]);
            thistilesize[1] = thistilesize[2] * (tlpixel[1] - tfpixel[1] + 1);
            offset[1] = (i1 - 1) * rowdim[1] + offset[2];
            for (i0 = ftile[0]; i0 <= ltile[0]; i0++)
            {
              tfpixel[0] = (i0 - 1) * tilesize[0] + 1;
              tlpixel[0] = minvalue(tfpixel[0] + tilesize[0] - 1, 
                                    naxis[0]);
              thistilesize[0] = thistilesize[1] * (tlpixel[0] - tfpixel[0] + 1);
              /* calculate row of table containing this tile */
              irow = i0 + offset[1];
 
              /* read and uncompress this row (tile) of the table */
              /* also do type conversion and undefined pixel substitution */
              /* at this point */

              imcomp_decompress_tile(fptr, irow, thistilesize[0],
                    datatype, nullcheck, nullval, buffer, bnullarray, &tilenul,
                     status);

               /* write the image to the output file */

              if (tilenul && anynul) {     
                   /* this assumes that the tiled pixels are in the same order
		      as in the uncompressed FITS image.  This is not necessarily
		      the case, but it almost alway is in practice.  
		      Note that null checking is not performed for integer images,
		      so this could only be a problem for tile compressed floating
		      point images that use an unconventional tiling pattern.
		   */
                   fits_write_imgnull(outfptr, datatype, firstelem, thistilesize[0],
		      buffer, nullval, status);
              } else {
                  fits_write_subset(outfptr, datatype, tfpixel, tlpixel, 
		      buffer, status);
              }

              firstelem += thistilesize[0];

            }
          }
        }
      }
     }
    }

    free(buffer);

    return(*status);
}